

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void sensors_analytics::Sdk::TrackInstallation(string *event_name,PropertiesNode *properties)

{
  Sdk *this;
  string *distinct_id;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [55];
  allocator local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  PropertiesNode properties_node;
  PropertiesNode *properties_local;
  string *event_name_local;
  
  if (instance_ != (Sdk *)0x0) {
    properties_node.super_ObjectNode.properties_map_._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = (size_t)properties;
    PropertiesNode::PropertiesNode((PropertiesNode *)local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"$ios_install_source",&local_71);
    utils::ObjectNode::SetString((ObjectNode *)local_50,(string *)local_70,"");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    utils::ObjectNode::MergeFrom
              ((ObjectNode *)local_50,
               (ObjectNode *)
               properties_node.super_ObjectNode.properties_map_._M_t._M_impl.super__Rb_tree_header.
               _M_node_count);
    this = instance_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"track",&local_a9);
    distinct_id = &instance_->distinct_id_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"",&local_d1);
    AddEvent(this,(string *)local_a8,event_name,(ObjectNode *)local_50,distinct_id,
             (string *)local_d0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    PropertiesNode::~PropertiesNode((PropertiesNode *)local_50);
  }
  return;
}

Assistant:

void Sdk::TrackInstallation(const string &event_name,
                            const PropertiesNode &properties) {
  if (instance_) {
    PropertiesNode properties_node;
    properties_node.SetString("$ios_install_source", "");
    properties_node.MergeFrom(properties);
    instance_->AddEvent("track",
                        event_name,
                        properties_node,
                        instance_->distinct_id_,
                        "");
  }
}